

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentVarLocation.cpp
# Opt level: O3

void __thiscall
license::locate::EnvironmentVarLocation::EnvironmentVarLocation(EnvironmentVarLocation *this)

{
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"EnvironmentVarLocation","");
  (this->super_LocatorStrategy)._vptr_LocatorStrategy =
       (_func_int **)&PTR_get_strategy_name_abi_cxx11__004b0538;
  (this->super_LocatorStrategy).m_strategy_name._M_dataplus._M_p =
       (pointer)&(this->super_LocatorStrategy).m_strategy_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_LocatorStrategy).m_strategy_name,local_38,local_38 + local_30);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  (this->super_LocatorStrategy)._vptr_LocatorStrategy =
       (_func_int **)&PTR_get_strategy_name_abi_cxx11__004b0448;
  return;
}

Assistant:

EnvironmentVarLocation::EnvironmentVarLocation() : LocatorStrategy("EnvironmentVarLocation") {}